

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs_file_base.cpp
# Opt level: O0

void __thiscall foxxll::ufs_file_base::close_remove(ufs_file_base *this)

{
  close_remove((ufs_file_base *)
               ((long)&this->_vptr_ufs_file_base + (long)this->_vptr_ufs_file_base[-0xd]));
  return;
}

Assistant:

void ufs_file_base::close_remove()
{
    close();

    if (is_device_) {
        TLX_LOG1 << "remove() path=" << filename_
                 << " skipped as file is device node";
        return;
    }

    if (::remove(filename_.c_str()) != 0)
        TLX_LOG1 << "remove() error on path=" << filename_
                 << " error=" << strerror(errno);
}